

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O1

shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> __thiscall
skiwi::make_deep_copy<skiwi::alpha_conversion_data>
          (skiwi *this,shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *env)

{
  environment<skiwi::alpha_conversion_data> *__args;
  element_type *peVar1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  environment<skiwi::alpha_conversion_data> *__tmp;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *outer;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> sVar5;
  undefined1 local_41;
  skiwi *local_40;
  element_type *local_38;
  
  __args = (env->
           super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_38 = (element_type *)this;
  if (__args == (environment<skiwi::alpha_conversion_data> *)0x0) {
    *(undefined8 *)this = 0;
    p_Var3 = (env->
             super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
  }
  else {
    *(undefined8 *)this = 0;
    local_40 = this + 8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<skiwi::environment<skiwi::alpha_conversion_data>,std::allocator<skiwi::environment<skiwi::alpha_conversion_data>>,skiwi::environment<skiwi::alpha_conversion_data>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_40,
               (environment<skiwi::alpha_conversion_data> **)this,
               (allocator<skiwi::environment<skiwi::alpha_conversion_data>_> *)&local_41,__args);
    peVar1 = *(element_type **)this;
    lVar2 = *(long *)&(peVar1->p_outer).
                      super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
    ;
    in_RDX._M_pi = extraout_RDX;
    while (lVar2 != 0) {
      outer = &peVar1->p_outer;
      _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      (_Var4._M_pi)->_M_use_count = 1;
      (_Var4._M_pi)->_M_weak_count = 1;
      (_Var4._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002a18a8;
      environment<skiwi::alpha_conversion_data>::environment
                ((environment<skiwi::alpha_conversion_data> *)(_Var4._M_pi + 1),outer);
      (outer->
      super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (environment<skiwi::alpha_conversion_data> *)(_Var4._M_pi + 1);
      this_00._M_pi =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&peVar1->p_outer + 8))->_M_pi;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&peVar1->p_outer + 8))->_M_pi =
           _Var4._M_pi;
      in_RDX._M_pi = extraout_RDX_00;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        in_RDX._M_pi = extraout_RDX_01;
      }
      peVar1 = (outer->
               super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      lVar2 = *(long *)&(peVar1->p_outer).
                        super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
  }
  sVar5.
  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  sVar5.
  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_38;
  return (shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>)
         sVar5.
         super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<environment<TEntry>> make_deep_copy(const std::shared_ptr<environment<TEntry>>& env)
  {
  if (!env.get())
    return env;
  std::shared_ptr<environment<TEntry>> out = std::make_shared<environment<TEntry>>(*env);
  //if (out->p_outer)
  //  out->p_outer = make_deep_copy(out->p_outer);
  auto* p_outer_copy = &(out->p_outer);
  while (*p_outer_copy)
    { // this loop is not tested anywhere yet
    *p_outer_copy = std::make_shared<environment<TEntry>>(*p_outer_copy);
    p_outer_copy = &((*p_outer_copy)->p_outer);
    }
  return out;
  }